

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O1

uint32_t read_vbyte(FILE *f)

{
  size_t sVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t chr;
  byte local_29;
  
  local_29 = 0;
  uVar3 = 0;
  uVar2 = 0;
  do {
    sVar1 = fread(&local_29,1,1,(FILE *)f);
    if ((int)sVar1 != 1) {
      quit("reading vbyte from file: %d != %d",sVar1 & 0xffffffff,1);
    }
    uVar3 = uVar3 + ((local_29 & 0x7f) << (uVar2 & 0x1f));
    uVar2 = uVar2 + 7;
  } while ((char)local_29 < '\0');
  return uVar3;
}

Assistant:

uint32_t read_vbyte(FILE* f)
{
    uint32_t x = 0;
    unsigned int shift = 0;
    uint8_t chr = 0;
    while (true) {
        int ret = fread(&chr, 1, 1, f);
        if (ret != 1) {
            quit("reading vbyte from file: %d != %d", ret, 1);
        }
        x += ((chr & 127) << shift);
        if (!(chr & 128)) {
            return x;
        }
        shift += 7;
    }
}